

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

bool __thiscall HPack::Decoder::decodeIndexedField(Decoder *this,BitIStream *inputStream)

{
  bool bVar1;
  ulong uVar2;
  size_t in_RCX;
  void *in_RDX;
  Decoder *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  BitPattern in_stack_0000000e;
  QByteArray value;
  QByteArray name;
  quint32 index;
  BitIStream *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar3;
  QByteArray *value_00;
  undefined5 in_stack_ffffffffffffffb8;
  byte in_stack_ffffffffffffffbd;
  undefined2 in_stack_ffffffffffffffbe;
  quint32 index_00;
  FieldLookupTable *this_00;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  value_00 = in_RDI;
  uVar2 = BitIStream::read((BitIStream *)in_RSI,(int)&local_c,in_RDX,in_RCX);
  if ((uVar2 & 1) == 0) {
    handleStreamError((Decoder *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
  }
  else {
    if (local_c == 0) {
      in_stack_ffffffffffffffbd = 0;
      goto LAB_00291d2c;
    }
    QByteArray::QByteArray((QByteArray *)0x291c69);
    index_00 = 0xaaaaaaaa;
    this_00 = (FieldLookupTable *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x291c97);
    bVar1 = FieldLookupTable::field
                      (this_00,index_00,
                       (QByteArray *)
                       CONCAT26(in_stack_ffffffffffffffbe,
                                CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8)),
                       value_00);
    if (bVar1) {
      in_stack_ffffffffffffffbd =
           processDecodedField(in_RSI,in_stack_0000000e,
                               (QByteArray *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI)
      ;
    }
    uVar3 = (uint)bVar1;
    QByteArray::~QByteArray((QByteArray *)0x291d00);
    QByteArray::~QByteArray((QByteArray *)0x291d0a);
    if (uVar3 != 0) goto LAB_00291d2c;
  }
  in_stack_ffffffffffffffbd = 0;
LAB_00291d2c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_ffffffffffffffbd & 1);
}

Assistant:

bool Decoder::decodeIndexedField(BitIStream &inputStream)
{
    quint32 index = 0;
    if (inputStream.read(&index)) {
        if (!index) {
            // "The index value of 0 is not used.
            //  It MUST be treated as a decoding
            //  error if found in an indexed header
            //  field representation."
            return false;
        }

        QByteArray name, value;
        if (lookupTable.field(index, &name, &value))
            return processDecodedField(Indexed, name, value);
    } else {
        handleStreamError(inputStream);
    }

    return false;
}